

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

String * capnp::_::enumString
                   (String *__return_storage_ptr__,uint16_t value,RawBrandedSchema *schema)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  unsigned_short *params;
  StringPtr value_00;
  Enumerant local_f8;
  Reader local_b8;
  StringPtr local_88;
  kj *local_78;
  char *local_70;
  Schema local_68;
  Schema local_60;
  undefined1 local_58 [8];
  EnumerantList enumerants;
  RawBrandedSchema *schema_local;
  String *pSStack_10;
  uint16_t value_local;
  
  enumerants.list.reader._40_8_ = schema;
  schema_local._6_2_ = value;
  pSStack_10 = __return_storage_ptr__;
  Schema::Schema(&local_68,schema);
  local_60.raw = (RawBrandedSchema *)Schema::asEnum(&local_68);
  EnumSchema::getEnumerants((EnumerantList *)local_58,(EnumSchema *)&local_60);
  uVar1 = (uint)schema_local._6_2_;
  uVar2 = EnumSchema::EnumerantList::size((EnumerantList *)local_58);
  uVar3 = (ulong)uVar2;
  if (uVar1 < uVar2) {
    EnumSchema::EnumerantList::operator[]
              (&local_f8,(EnumerantList *)local_58,(uint)schema_local._6_2_);
    EnumSchema::Enumerant::getProto(&local_b8,&local_f8);
    local_88.content = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&local_b8);
    local_78 = (kj *)local_88.content.ptr;
    local_70 = (char *)local_88.content.size_;
    value_00.content.size_ = uVar3;
    value_00.content.ptr = (char *)local_88.content.size_;
    kj::heapString(__return_storage_ptr__,(kj *)local_88.content.ptr,value_00);
  }
  else {
    kj::str<unsigned_short&>(__return_storage_ptr__,(kj *)((long)&schema_local + 6),params);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String enumString(uint16_t value, const RawBrandedSchema& schema) {
  auto enumerants = Schema(&schema).asEnum().getEnumerants();
  if (value < enumerants.size()) {
    return kj::heapString(enumerants[value].getProto().getName());
  } else {
    return kj::str(value);
  }
}